

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddApply.c
# Opt level: O3

DdNode * cuddAddMonadicApplyRecur(DdManager *dd,DD_MAOP op,DdNode *f)

{
  int *piVar1;
  DdHalfWord index;
  DdNode *pDVar2;
  DdNode *T;
  DdNode *data;
  
  pDVar2 = (*op)(dd,f);
  if ((pDVar2 == (DdNode *)0x0) && (pDVar2 = cuddCacheLookup1(dd,op,f), pDVar2 == (DdNode *)0x0)) {
    index = f->index;
    pDVar2 = (f->type).kids.E;
    T = cuddAddMonadicApplyRecur(dd,op,(f->type).kids.T);
    if (T != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)T & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar2 = cuddAddMonadicApplyRecur(dd,op,pDVar2);
      if (pDVar2 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        data = T;
        if ((T == pDVar2) || (data = cuddUniqueInter(dd,index,T,pDVar2), data != (DdNode *)0x0)) {
          piVar1 = (int *)(((ulong)T & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          cuddCacheInsert1(dd,op,f,data);
          return data;
        }
        Cudd_RecursiveDeref(dd,T);
        T = pDVar2;
      }
      Cudd_RecursiveDeref(dd,T);
    }
    pDVar2 = (DdNode *)0x0;
  }
  return pDVar2;
}

Assistant:

DdNode *
cuddAddMonadicApplyRecur(
  DdManager * dd,
  DD_MAOP op,
  DdNode * f)
{
    DdNode *res, *ft, *fe, *T, *E;
    unsigned int index;

    /* Check terminal cases. */
    statLine(dd);
    res = (*op)(dd,f);
    if (res != NULL) return(res);

    /* Check cache. */
    res = cuddCacheLookup1(dd,op,f);
    if (res != NULL) return(res);

    /* Recursive step. */
    index = f->index;
    ft = cuddT(f);
    fe = cuddE(f);

    T = cuddAddMonadicApplyRecur(dd,op,ft);
    if (T == NULL) return(NULL);
    cuddRef(T);

    E = cuddAddMonadicApplyRecur(dd,op,fe);
    if (E == NULL) {
        Cudd_RecursiveDeref(dd,T);
        return(NULL);
    }
    cuddRef(E);

    res = (T == E) ? T : cuddUniqueInter(dd,(int)index,T,E);
    if (res == NULL) {
        Cudd_RecursiveDeref(dd, T);
        Cudd_RecursiveDeref(dd, E);
        return(NULL);
    }
    cuddDeref(T);
    cuddDeref(E);

    /* Store result. */
    cuddCacheInsert1(dd,op,f,res);

    return(res);

}